

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_int,bool>
          (BaseAppender *this,Vector *col,uint input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  bool result;
  bool local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_int,bool>(input,&local_39,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_39;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_int,bool>(&local_38,(duckdb *)(ulong)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}